

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_pfx.cpp
# Opt level: O3

void Convert32(BYTE *src,int srcpitch,void *destin,int destpitch,int destwidth,int destheight,
              fixed_t xstep,fixed_t ystep,fixed_t xfrac,fixed_t yfrac)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  fixed_t fVar4;
  uint uVar5;
  
  if (destheight != 0 || destwidth != 0) {
    iVar2 = (destpitch >> 2) - destwidth;
    if (ystep == 0x10000 && xstep == 0x10000) {
      if (destheight != 0) {
        do {
          iVar3 = destwidth >> 3;
          uVar5 = destwidth & 7;
          if (7 < (uint)destwidth) {
            do {
              *(DWORD *)destin = GPfxPal.Pal32[*src];
              *(DWORD *)((long)destin + 4) = GPfxPal.Pal32[src[1]];
              *(DWORD *)((long)destin + 8) = GPfxPal.Pal32[src[2]];
              *(DWORD *)((long)destin + 0xc) = GPfxPal.Pal32[src[3]];
              *(DWORD *)((long)destin + 0x10) = GPfxPal.Pal32[src[4]];
              *(DWORD *)((long)destin + 0x14) = GPfxPal.Pal32[src[5]];
              *(DWORD *)((long)destin + 0x18) = GPfxPal.Pal32[src[6]];
              *(DWORD *)((long)destin + 0x1c) = GPfxPal.Pal32[src[7]];
              destin = (void *)((long)destin + 0x20);
              src = src + 8;
              iVar3 = iVar3 + -1;
            } while (iVar3 != 0);
          }
          for (; uVar5 != 0; uVar5 = uVar5 - 1) {
            bVar1 = *src;
            src = src + 1;
            *(DWORD *)destin = GPfxPal.Pal32[bVar1];
            destin = (void *)((long)destin + 4);
          }
          src = src + (srcpitch - destwidth);
          destin = (void *)((long)destin + (long)iVar2 * 4);
          destheight = destheight + -1;
        } while (destheight != 0);
      }
    }
    else if (destheight != 0) {
      do {
        fVar4 = xfrac;
        iVar3 = destwidth >> 1;
        if (1 < (uint)destwidth) {
          do {
            *(DWORD *)destin = GPfxPal.Pal32[src[fVar4 >> 0x10]];
            *(DWORD *)((long)destin + 4) = GPfxPal.Pal32[src[fVar4 + xstep >> 0x10]];
            fVar4 = fVar4 + xstep + xstep;
            destin = (void *)((long)destin + 8);
            iVar3 = iVar3 + -1;
          } while (iVar3 != 0);
        }
        if ((destwidth & 1U) != 0) {
          *(DWORD *)destin = GPfxPal.Pal32[src[fVar4 >> 0x10]];
          destin = (void *)((long)destin + 4);
        }
        uVar5 = ystep + yfrac;
        if (0xffff < (int)uVar5) {
          if (0x1fffe < uVar5) {
            uVar5 = 0x1ffff;
          }
          uVar5 = (ystep + 0xffff + yfrac) - uVar5;
          src = src + (ulong)((uVar5 >> 0x10) + 1) * (long)srcpitch;
          uVar5 = (yfrac + ystep + -0x10000) - (uVar5 & 0xffff0000);
        }
        yfrac = uVar5;
        destin = (void *)((long)destin + (long)iVar2 * 4);
        destheight = destheight + -1;
      } while (destheight != 0);
    }
  }
  return;
}

Assistant:

static void Convert32 (BYTE *src, int srcpitch,
	void *destin, int destpitch, int destwidth, int destheight,
	fixed_t xstep, fixed_t ystep, fixed_t xfrac, fixed_t yfrac)
{
	if ((destwidth | destheight) == 0)
	{
		return;
	}

	int x, y, savedx;
	DWORD *dest = (DWORD *)destin;

	destpitch = (destpitch >> 2) - destwidth;
	if (xstep == FRACUNIT && ystep == FRACUNIT)
	{
		srcpitch -= destwidth;
		for (y = destheight; y != 0; y--)
		{
			for (savedx = x = destwidth, x >>= 3; x != 0; x--)
			{
				dest[0] = GPfxPal.Pal32[src[0]];
				dest[1] = GPfxPal.Pal32[src[1]];
				dest[2] = GPfxPal.Pal32[src[2]];
				dest[3] = GPfxPal.Pal32[src[3]];
				dest[4] = GPfxPal.Pal32[src[4]];
				dest[5] = GPfxPal.Pal32[src[5]];
				dest[6] = GPfxPal.Pal32[src[6]];
				dest[7] = GPfxPal.Pal32[src[7]];
				dest += 8;
				src += 8;
			}
			for (x = savedx & 7; x != 0; x--)
			{
				*dest++ = GPfxPal.Pal32[*src++];
			}
			dest += destpitch;
			src += srcpitch;
		}
	}
	else
	{
		for (y = destheight; y != 0; y--)
		{
			fixed_t xf = xfrac;
			for (savedx = x = destwidth, x >>= 1; x != 0; x--)
			{
				dest[0] = GPfxPal.Pal32[src[xf >> FRACBITS]];		xf += xstep;
				dest[1] = GPfxPal.Pal32[src[xf >> FRACBITS]];		xf += xstep;
				dest += 2;
			}
			if (savedx & 1)
			{
				*dest++ = GPfxPal.Pal32[src[xf >> FRACBITS]];
			}
			yfrac += ystep;
			while (yfrac >= FRACUNIT)
			{
				yfrac -= FRACUNIT;
				src += srcpitch;
			}
			dest += destpitch;
		}
	}
}